

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3UniqueConstraint(Parse *pParse,int onError,Index *pIdx)

{
  char *pcVar1;
  char *in_RDX;
  int in_ESI;
  Parse *in_RDI;
  long in_FS_OFFSET;
  char *zCol;
  Table *pTab;
  int j;
  char *zErr;
  StrAccum errMsg;
  StrAccum *in_stack_ffffffffffffff98;
  sqlite3_str *p;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar2;
  int in_stack_ffffffffffffffc8;
  undefined1 local_28 [24];
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  pcVar1 = *(char **)(in_RDX + 0x18);
  sqlite3StrAccumInit((StrAccum *)local_28,in_RDI->db,(char *)0x0,0,in_RDI->db->aLimit[0]);
  if (*(long *)(in_RDX + 0x50) == 0) {
    for (iVar2 = 0; iVar2 < (int)(uint)*(ushort *)(in_RDX + 0x5e); iVar2 = iVar2 + 1) {
      p = *(sqlite3_str **)
           (*(long *)(pcVar1 + 8) + (long)*(short *)(*(long *)(in_RDX + 8) + (long)iVar2 * 2) * 0x10
           );
      if (iVar2 != 0) {
        sqlite3_str_append(p,(char *)in_stack_ffffffffffffff98,0);
      }
      sqlite3_str_appendall((sqlite3_str *)CONCAT44(iVar2,in_stack_ffffffffffffffb0),pcVar1);
      sqlite3_str_append(p,(char *)in_stack_ffffffffffffff98,0);
      sqlite3_str_appendall((sqlite3_str *)CONCAT44(iVar2,in_stack_ffffffffffffffb0),pcVar1);
    }
  }
  else {
    sqlite3_str_appendf((StrAccum *)local_28,"index \'%q\'",*(undefined8 *)in_RDX);
  }
  pcVar1 = sqlite3StrAccumFinish(in_stack_ffffffffffffff98);
  sqlite3HaltConstraint
            (in_RDI,in_ESI,in_stack_ffffffffffffffc8,in_RDX,(i8)((ulong)pcVar1 >> 0x38),
             (u8)((ulong)pcVar1 >> 0x30));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3UniqueConstraint(
  Parse *pParse,    /* Parsing context */
  int onError,      /* Constraint type */
  Index *pIdx       /* The index that triggers the constraint */
){
  char *zErr;
  int j;
  StrAccum errMsg;
  Table *pTab = pIdx->pTable;

  sqlite3StrAccumInit(&errMsg, pParse->db, 0, 0,
                      pParse->db->aLimit[SQLITE_LIMIT_LENGTH]);
  if( pIdx->aColExpr ){
    sqlite3_str_appendf(&errMsg, "index '%q'", pIdx->zName);
  }else{
    for(j=0; j<pIdx->nKeyCol; j++){
      char *zCol;
      assert( pIdx->aiColumn[j]>=0 );
      zCol = pTab->aCol[pIdx->aiColumn[j]].zCnName;
      if( j ) sqlite3_str_append(&errMsg, ", ", 2);
      sqlite3_str_appendall(&errMsg, pTab->zName);
      sqlite3_str_append(&errMsg, ".", 1);
      sqlite3_str_appendall(&errMsg, zCol);
    }
  }
  zErr = sqlite3StrAccumFinish(&errMsg);
  sqlite3HaltConstraint(pParse,
    IsPrimaryKeyIndex(pIdx) ? SQLITE_CONSTRAINT_PRIMARYKEY
                            : SQLITE_CONSTRAINT_UNIQUE,
    onError, zErr, P4_DYNAMIC, P5_ConstraintUnique);
}